

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O1

uchar __thiscall Memory::LargeObjectHeader::GetAttributes(LargeObjectHeader *this,uint cookie)

{
  ushort uVar1;
  byte calculatedChecksum;
  uint uVar2;
  
  uVar1 = this->attributesAndChecksum ^ (ushort)cookie;
  uVar2 = cookie ^ *(uint *)&this->next;
  calculatedChecksum =
       (byte)(uVar2 >> 0x18) ^ (byte)uVar2 ^ (byte)(uVar2 >> 0x10) ^ (byte)(uVar2 >> 8) ^
       (byte)(uVar1 >> 8);
  if (calculatedChecksum != (byte)uVar1) {
    LargeHeapBlock_Metadata_Corrupted((ULONG_PTR)this,calculatedChecksum);
  }
  return (byte)(this->attributesAndChecksum >> 8) ^ (byte)(cookie >> 8);
}

Assistant:

unsigned char
LargeObjectHeader::GetAttributes(uint cookie)
{
#ifdef LARGEHEAPBLOCK_ENCODING

    LargeObjectHeader *decodedNext = this->DecodeNext(cookie, this->next);
    ushort decodedAttributesAndChecksum = this->DecodeAttributesAndChecksum(cookie);

    unsigned char checkSum = (unsigned char)(decodedAttributesAndChecksum & 0xFF);
    unsigned char calculatedCheckSumField = this->CalculateCheckSum(decodedNext, (unsigned char)(decodedAttributesAndChecksum >> 8));
    if (checkSum != calculatedCheckSumField)
    {
        LargeHeapBlock_Metadata_Corrupted((ULONG_PTR)this, calculatedCheckSumField);
    }

    // If checksum matches return the up-to-date attributes (in case other thread changed it from last time
    // we read it in this method.
    return this->DecodeAttributesAndChecksum(cookie) >> 8;
#else
    return this->attributes;
#endif
}